

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  int iVar1;
  int iVar2;
  Vdbe *v;
  long lVar3;
  
  v = pParse->pVdbe;
  lVar3 = 0x84;
  while( true ) {
    if ((int)lVar3 == 0x174) {
      sqlite3ExprCodeGetColumnOfTable(v,pTab,iTable,iColumn,iReg);
      if (p5 == '\0') {
        sqlite3ExprCacheStore(pParse,iTable,iColumn,iReg);
      }
      else if (v->aOp != (Op *)0x0) {
        v->aOp[(long)v->nOp + -1].p5 = p5;
      }
      return iReg;
    }
    iVar1 = *(int *)((long)pParse->aTempReg + lVar3 + -0x2c);
    if (((0 < iVar1) && (*(int *)((long)pParse->aTempReg + lVar3 + -0x3c) == iTable)) &&
       (*(int *)((long)pParse->aTempReg + lVar3 + -0x38) == iColumn)) break;
    lVar3 = lVar3 + 0x18;
  }
  iVar2 = pParse->iCacheCnt;
  pParse->iCacheCnt = iVar2 + 1;
  *(int *)((long)pParse->aTempReg + lVar3 + -0x28) = iVar2;
  for (lVar3 = 0; (int)lVar3 != 0xf0; lVar3 = lVar3 + 0x18) {
    if (*(int *)((long)&pParse->aColCache[0].iReg + lVar3) == iVar1) {
      (&pParse->aColCache[0].tempReg)[lVar3] = '\0';
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct yColCache *p;

  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg>0 && p->iTable==iTable && p->iColumn==iColumn ){
      p->lru = pParse->iCacheCnt++;
      sqlite3ExprCachePinRegister(pParse, p->iReg);
      return p->iReg;
    }
  }  
  assert( v!=0 );
  sqlite3ExprCodeGetColumnOfTable(v, pTab, iTable, iColumn, iReg);
  if( p5 ){
    sqlite3VdbeChangeP5(v, p5);
  }else{   
    sqlite3ExprCacheStore(pParse, iTable, iColumn, iReg);
  }
  return iReg;
}